

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergePartialFromCodedStream
          (CodeGeneratorResponse *this,CodedInputStream *input)

{
  bool bVar1;
  uint uVar2;
  string *value;
  Type *value_00;
  uint8 *puVar3;
  uint32 tag;
  
  do {
    while( true ) {
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar3 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar2 = tag & 7;
      if (tag >> 3 != 0xf) break;
      if (uVar2 == 2) goto LAB_001aad9a;
LAB_001aad80:
      if (uVar2 == 4) {
        return true;
      }
      bVar1 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
      if (!bVar1) {
        return false;
      }
    }
    if ((tag >> 3 != 1) || (uVar2 != 2)) goto LAB_001aad80;
    value = mutable_error_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,value);
    if (!bVar1) {
      return false;
    }
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->error_->_M_dataplus)._M_p,(int)this->error_->_M_string_length,PARSE);
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (*puVar3 == 'z')) {
      do {
        input->buffer_ = puVar3 + 1;
LAB_001aad9a:
        value_00 = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
                             (&(this->file_).super_RepeatedPtrFieldBase);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::compiler::CodeGeneratorResponse_File>
                          (input,value_00);
        if (!bVar1) {
          return false;
        }
        puVar3 = input->buffer_;
      } while ((puVar3 < input->buffer_end_) && (*puVar3 == 'z'));
      bVar1 = io::CodedInputStream::ExpectAtEnd(input);
      if (bVar1) {
        return true;
      }
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string error = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_error()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->error().data(), this->error().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        break;
      }

      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}